

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O3

int GetLatestDataRazorAHRS(RAZORAHRS *pRazorAHRS,RAZORAHRSDATA *pRazorAHRSData)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong __n;
  long lVar11;
  RAZORAHRSDATA *pRVar12;
  uint uVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  timespec local_398;
  CHRONO chrono;
  char recvbuf [512];
  char savebuf [256];
  
  bVar14 = 0;
  iVar5 = clock_getres(4,(timespec *)&chrono.Frequency);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,(timespec *)&chrono), iVar5 == 0)) {
    chrono.Suspended = 0;
    chrono.Finish.tv_sec = 0;
    chrono.Finish.tv_nsec = 0;
    chrono.Duration.tv_sec = 0;
    chrono.Duration.tv_nsec = 0;
  }
  memset(recvbuf,0,0x200);
  memset(savebuf,0,0x100);
  iVar5 = (pRazorAHRS->RS232Port).DevType;
  if (iVar5 - 1U < 4) {
    uVar6 = recv((pRazorAHRS->RS232Port).s,recvbuf,0xff,0);
LAB_001119d0:
    uVar13 = (uint)uVar6;
    if (0 < (int)uVar13) {
      if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,uVar6 & 0xffffffff,1,(FILE *)pRazorAHRS->pfSaveFile);
        fflush((FILE *)pRazorAHRS->pfSaveFile);
      }
      if (0xfe < uVar13) {
        if (uVar13 == 0xff) {
          do {
            lVar11 = chrono.Duration.tv_sec;
            lVar10 = chrono.Duration.tv_nsec;
            if (chrono.Suspended == 0) {
              clock_gettime(4,&local_398);
              lVar11 = ((local_398.tv_sec + chrono.Duration.tv_sec) - chrono.Start.tv_sec) +
                       (local_398.tv_nsec + chrono.Duration.tv_nsec) / 1000000000;
              lVar10 = (local_398.tv_nsec + chrono.Duration.tv_nsec) % 1000000000 -
                       chrono.Start.tv_nsec;
              if (lVar10 < 0) {
                lVar11 = lVar11 + ~((ulong)-lVar10 / 1000000000);
                lVar10 = lVar10 + 1000000000 + ((ulong)-lVar10 / 1000000000) * 1000000000;
              }
            }
            if (4.0 < (double)lVar10 / 1000000000.0 + (double)lVar11) goto LAB_00112166;
            memcpy(savebuf,recvbuf,0xff);
            iVar5 = (pRazorAHRS->RS232Port).DevType;
            if (iVar5 - 1U < 4) {
              uVar6 = recv((pRazorAHRS->RS232Port).s,recvbuf,0xff,0);
            }
            else {
              if (iVar5 != 0) goto LAB_00112143;
              uVar6 = read(*(int *)&(pRazorAHRS->RS232Port).hDev,recvbuf,0xff);
            }
            if ((int)uVar6 < 1) goto LAB_00112143;
            if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0))
            {
              fwrite(recvbuf,uVar6 & 0xffffffff,1,(FILE *)pRazorAHRS->pfSaveFile);
              fflush((FILE *)pRazorAHRS->pfSaveFile);
            }
          } while ((int)uVar6 == 0xff);
        }
        __n = uVar6 & 0xffffffff;
        memmove(recvbuf + (0xff - __n),recvbuf,__n);
        memcpy(recvbuf,savebuf + __n,(long)(0xff - (int)uVar6));
        uVar6 = 0xff;
      }
      pcVar7 = strstr(recvbuf,"#YPR=");
      if ((pcVar7 == (char *)0x0) || (pcVar8 = strstr(pcVar7 + 5,"\r\n"), pcVar8 == (char *)0x0)) {
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          pcVar8 = pcVar7;
          pcVar7 = strstr(pcVar8 + 5,"#YPR=");
          if (pcVar7 == (char *)0x0) break;
          pcVar9 = strstr(pcVar7 + 5,"\r\n");
        } while (pcVar9 != (char *)0x0);
      }
      pcVar7 = strstr(recvbuf,"#YPRAG=");
      lVar11 = chrono.Duration.tv_sec;
      lVar10 = chrono.Duration.tv_nsec;
      if ((pcVar7 != (char *)0x0) &&
         (pcVar9 = strstr(pcVar7 + 7,"\r\n"), lVar11 = chrono.Duration.tv_sec,
         lVar10 = chrono.Duration.tv_nsec, pcVar9 != (char *)0x0)) {
        do {
          pcVar8 = pcVar7;
          pcVar7 = strstr(pcVar8 + 7,"#YPRAG=");
          if (pcVar7 == (char *)0x0) break;
          pcVar9 = strstr(pcVar7 + 7,"\r\n");
        } while (pcVar9 != (char *)0x0);
        goto LAB_00111cc9;
      }
      while (chrono.Duration.tv_sec = lVar11, chrono.Duration.tv_nsec = lVar10,
            pcVar8 == (char *)0x0) {
        if (chrono.Suspended == 0) {
          clock_gettime(4,&local_398);
          lVar11 = ((local_398.tv_sec + chrono.Duration.tv_sec) - chrono.Start.tv_sec) +
                   (local_398.tv_nsec + chrono.Duration.tv_nsec) / 1000000000;
          lVar10 = (local_398.tv_nsec + chrono.Duration.tv_nsec) % 1000000000 - chrono.Start.tv_nsec
          ;
          if (lVar10 < 0) {
            lVar11 = lVar11 + ~((ulong)-lVar10 / 1000000000);
            lVar10 = lVar10 + 1000000000 + ((ulong)-lVar10 / 1000000000) * 1000000000;
          }
        }
        if (4.0 < (double)lVar10 / 1000000000.0 + (double)lVar11) {
LAB_00112166:
          puts("Error reading data from a RazorAHRS : Message timeout. ");
          return 2;
        }
        uVar13 = (uint)uVar6;
        if (0x1fe < uVar13) {
          puts("Error reading data from a RazorAHRS : Invalid data. ");
          return 4;
        }
        pcVar7 = recvbuf + (uVar6 & 0xffffffff);
        iVar5 = (pRazorAHRS->RS232Port).DevType;
        if (iVar5 - 1U < 4) {
          uVar6 = recv((pRazorAHRS->RS232Port).s,pcVar7,(ulong)(0x1ff - uVar13),0);
        }
        else {
          if (iVar5 != 0) goto LAB_00112143;
          uVar6 = read(*(int *)&(pRazorAHRS->RS232Port).hDev,pcVar7,(ulong)(0x1ff - uVar13));
        }
        if ((int)uVar6 < 1) goto LAB_00112143;
        if ((pRazorAHRS->bSaveRawData != 0) && ((FILE *)pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          fwrite(pcVar7,uVar6 & 0xffffffff,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
        pcVar7 = strstr(recvbuf,"#YPR=");
        if ((pcVar7 == (char *)0x0) || (pcVar8 = strstr(pcVar7 + 5,"\r\n"), pcVar8 == (char *)0x0))
        {
          pcVar8 = (char *)0x0;
        }
        else {
          do {
            pcVar8 = pcVar7;
            pcVar7 = strstr(pcVar8 + 5,"#YPR=");
            if (pcVar7 == (char *)0x0) break;
            pcVar9 = strstr(pcVar7 + 5,"\r\n");
          } while (pcVar9 != (char *)0x0);
        }
        pcVar7 = strstr(recvbuf,"#YPRAG=");
        if ((pcVar7 != (char *)0x0) && (pcVar9 = strstr(pcVar7 + 7,"\r\n"), pcVar9 != (char *)0x0))
        goto LAB_0011219f;
        uVar6 = (ulong)(uVar13 + (int)uVar6);
        lVar11 = chrono.Duration.tv_sec;
        lVar10 = chrono.Duration.tv_nsec;
      }
      pRazorAHRSData->Pitch = 0.0;
      pRazorAHRSData->Yaw = 0.0;
      pRazorAHRSData->gyrz = 0.0;
      pRazorAHRSData->Roll = 0.0;
      pRazorAHRSData->gyrx = 0.0;
      pRazorAHRSData->gyry = 0.0;
      pRazorAHRSData->accy = 0.0;
      pRazorAHRSData->accz = 0.0;
      pRazorAHRSData->roll = 0.0;
      pRazorAHRSData->accx = 0.0;
      pRazorAHRSData->yaw = 0.0;
      pRazorAHRSData->pitch = 0.0;
      iVar5 = __isoc99_sscanf(pcVar8,"#YPR=%lf,%lf,%lf",pRazorAHRSData,&pRazorAHRSData->pitch,
                              &pRazorAHRSData->roll);
      if (iVar5 == 3) goto LAB_00111d95;
      goto LAB_00111d36;
    }
  }
  else if (iVar5 == 0) {
    uVar6 = read(*(int *)&(pRazorAHRS->RS232Port).hDev,recvbuf,0xff);
    goto LAB_001119d0;
  }
LAB_00112143:
  pcVar7 = "Error reading data from a RazorAHRS. ";
  goto LAB_0011214a;
  while (pcVar9 = strstr(pcVar7 + 7,"\r\n"), pcVar9 != (char *)0x0) {
LAB_0011219f:
    pcVar8 = pcVar7;
    pcVar7 = strstr(pcVar8 + 7,"#YPRAG=");
    if (pcVar7 == (char *)0x0) break;
  }
LAB_00111cc9:
  pRazorAHRSData->Pitch = 0.0;
  pRazorAHRSData->Yaw = 0.0;
  pRazorAHRSData->gyrz = 0.0;
  pRazorAHRSData->Roll = 0.0;
  pRazorAHRSData->gyrx = 0.0;
  pRazorAHRSData->gyry = 0.0;
  pRazorAHRSData->accy = 0.0;
  pRazorAHRSData->accz = 0.0;
  pRazorAHRSData->roll = 0.0;
  pRazorAHRSData->accx = 0.0;
  pRazorAHRSData->yaw = 0.0;
  pRazorAHRSData->pitch = 0.0;
  iVar5 = __isoc99_sscanf(pcVar8,"#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",pRazorAHRSData,
                          &pRazorAHRSData->pitch,&pRazorAHRSData->roll,&pRazorAHRSData->accx,
                          &pRazorAHRSData->accy,&pRazorAHRSData->accz,&pRazorAHRSData->gyrx,
                          &pRazorAHRSData->gyry,&pRazorAHRSData->gyrz);
  if (iVar5 == 9) {
LAB_00111d95:
    dVar3 = (pRazorAHRSData->roll * 3.141592653589793) / 180.0;
    dVar16 = (pRazorAHRSData->pitch * 3.141592653589793) / 180.0;
    dVar15 = (pRazorAHRSData->yaw * 3.141592653589793) / 180.0;
    dVar1 = pRazorAHRS->rollorientation;
    dVar2 = pRazorAHRS->rollp1;
    dVar4 = cos(dVar3 + pRazorAHRS->rollp2);
    dVar1 = fmod(dVar4 * dVar2 + dVar1 + dVar3,6.283185307179586);
    dVar1 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
    pRazorAHRSData->Roll = dVar1 + -3.141592653589793;
    dVar1 = pRazorAHRS->pitchorientation;
    dVar2 = pRazorAHRS->pitchp1;
    dVar3 = cos(dVar16 + pRazorAHRS->pitchp2);
    dVar1 = fmod(dVar3 * dVar2 + dVar1 + dVar16,6.283185307179586);
    dVar1 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
    pRazorAHRSData->Pitch = dVar1 + -3.141592653589793;
    dVar1 = pRazorAHRS->yaworientation;
    dVar2 = pRazorAHRS->yawp1;
    dVar3 = cos(dVar15 + pRazorAHRS->yawp2);
    dVar1 = fmod(dVar3 * dVar2 + dVar1 + dVar15,6.283185307179586);
    dVar1 = fmod(dVar1 + 9.42477796076938,6.283185307179586);
    pRazorAHRSData->Yaw = dVar1 + -3.141592653589793;
    pRVar12 = &pRazorAHRS->LastRazorAHRSData;
    for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
      pRVar12->yaw = pRazorAHRSData->yaw;
      pRazorAHRSData = (RAZORAHRSDATA *)((long)pRazorAHRSData + (ulong)bVar14 * -0x10 + 8);
      pRVar12 = (RAZORAHRSDATA *)((long)pRVar12 + (ulong)bVar14 * -0x10 + 8);
    }
    return 0;
  }
LAB_00111d36:
  pcVar7 = "Error reading data from a RazorAHRS : Invalid data. ";
LAB_0011214a:
  puts(pcVar7);
  return 1;
}

Assistant:

inline int GetLatestDataRazorAHRS(RAZORAHRS* pRazorAHRS, RAZORAHRSDATA* pRazorAHRSData)
{
	char recvbuf[2*MAX_NB_BYTES_RAZORAHRS];
	char savebuf[MAX_NB_BYTES_RAZORAHRS];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_YPR = NULL;
	char* ptr_YPRAG = NULL;
	double roll = 0, pitch = 0, yaw = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_RAZORAHRS-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RazorAHRS. \n");
		return EXIT_FAILURE;
	}
	if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
		fflush(pRazorAHRS->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
			{
				printf("Error reading data from a RazorAHRS : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a RazorAHRS. \n");
				return EXIT_FAILURE;
			}
			if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
				fflush(pRazorAHRS->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
	ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);

	while ((!ptr_YPR)&&(!ptr_YPRAG))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
		{
			printf("Error reading data from a RazorAHRS : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_RAZORAHRS-1)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_RAZORAHRS-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RazorAHRS. \n");
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
		ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);
	}

	// Analyze data.

	memset(pRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (ptr_YPRAG)
	{
		if (sscanf(ptr_YPRAG, "#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll, 
			&pRazorAHRSData->accx, &pRazorAHRSData->accy, &pRazorAHRSData->accz, 
			&pRazorAHRSData->gyrx, &pRazorAHRSData->gyry, &pRazorAHRSData->gyrz) != 9)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sscanf(ptr_YPR, "#YPR=%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll) != 3)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	// Convert orientation information in angles in rad with corrections.

	roll = pRazorAHRSData->roll*M_PI/180.0;
	pitch = pRazorAHRSData->pitch*M_PI/180.0;
	yaw = pRazorAHRSData->yaw*M_PI/180.0;

	// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
	pRazorAHRSData->Roll = fmod_2PI(roll+pRazorAHRS->rollorientation+pRazorAHRS->rollp1*cos(roll+pRazorAHRS->rollp2));
	pRazorAHRSData->Pitch = fmod_2PI(pitch+pRazorAHRS->pitchorientation+pRazorAHRS->pitchp1*cos(pitch+pRazorAHRS->pitchp2));
	pRazorAHRSData->Yaw = fmod_2PI(yaw+pRazorAHRS->yaworientation+pRazorAHRS->yawp1*cos(yaw+pRazorAHRS->yawp2));

	pRazorAHRS->LastRazorAHRSData = *pRazorAHRSData;

	return EXIT_SUCCESS;
}